

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bus.c
# Opt level: O1

void bus0_sock_send(void *arg,nni_aio *aio)

{
  nni_mtx *mtx;
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  nni_msg *m;
  size_t count;
  size_t sVar4;
  undefined8 *item;
  
  m = nni_aio_get_msg(aio);
  count = nni_msg_len(m);
  uVar2 = 0;
  nni_aio_set_msg(aio,(nni_msg *)0x0);
  if (*(char *)((long)arg + 0xc4) == '\x01') {
    sVar4 = nni_msg_header_len(m);
    uVar2 = 0;
    if (3 < sVar4) {
      uVar2 = nni_msg_header_trim_u32(m);
    }
  }
  else {
    nni_msg_header_clear(m);
  }
  mtx = (nni_mtx *)((long)arg + 0x18);
  nni_mtx_lock(mtx);
  _Var1 = nni_aio_start(aio,(nni_aio_cancel_fn)0x0,(void *)0x0);
  if (!_Var1) {
    nni_mtx_unlock(mtx);
    return;
  }
  for (item = (undefined8 *)nni_list_first((nni_list *)arg); item != (undefined8 *)0x0;
      item = (undefined8 *)nni_list_next((nni_list *)arg,item)) {
    if ((*(char *)((long)arg + 0xc4) != '\x01') ||
       (uVar3 = nni_pipe_id((nni_pipe *)*item), uVar3 != uVar2)) {
      if (*(char *)(item + 0xd) == '\0') {
        *(undefined1 *)(item + 0xd) = 1;
        nni_msg_clone(m);
        nni_aio_set_msg((nni_aio *)(item + 0x47),m);
        nni_pipe_send((nni_pipe *)*item,(nni_aio *)(item + 0x47));
      }
      else {
        _Var1 = nni_lmq_full((nni_lmq *)(item + 2));
        if (!_Var1) {
          nni_msg_clone(m);
          nni_lmq_put((nni_lmq *)(item + 2),m);
        }
      }
    }
  }
  nni_mtx_unlock(mtx);
  nni_msg_free(m);
  nni_aio_finish(aio,NNG_OK,count);
  return;
}

Assistant:

static void
bus0_sock_send(void *arg, nni_aio *aio)
{
	bus0_sock *s = arg;
	nni_msg   *msg;
	bus0_pipe *pipe;
	uint32_t   sender = 0;
	size_t     len;

	msg = nni_aio_get_msg(aio);
	len = nni_msg_len(msg);
	nni_aio_set_msg(aio, NULL);

	// this test is so that we detect when the aio itself is terminated,
	// otherwise we could loop forever.

	if (s->raw) {
		// In raw mode, we look for the message header, to see if it
		// is being resent from another pipe (e.g. via a device).
		// We don't want to send it back to the originator.
		if (nni_msg_header_len(msg) >= sizeof(uint32_t)) {
			sender = nni_msg_header_trim_u32(msg);
		}
	} else {
		// In cooked mode just strip the header.
		nni_msg_header_clear(msg);
	}

	nni_mtx_lock(&s->mtx);

	if (!nni_aio_start(aio, NULL, NULL)) {
		nni_mtx_unlock(&s->mtx);
		return;
	}

	NNI_LIST_FOREACH (&s->pipes, pipe) {

		if (s->raw && nni_pipe_id(pipe->pipe) == sender) {
			continue;
		}

		// if the pipe isn't busy, then send this message direct.
		if (!pipe->busy) {
			pipe->busy = true;
			nni_msg_clone(msg);
			nni_aio_set_msg(&pipe->aio_send, msg);
			nni_pipe_send(pipe->pipe, &pipe->aio_send);
		} else if (!nni_lmq_full(&pipe->send_queue)) {
			nni_msg_clone(msg);
			nni_lmq_put(&pipe->send_queue, msg);
		}
	}
	nni_mtx_unlock(&s->mtx);

	nni_msg_free(msg);
	nni_aio_finish(aio, 0, len);
}